

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_create_function_v2
              (sqlite3 *db,char *zFunc,int nArg,int enc,void *p,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
              _func_void_sqlite3_context_ptr *xFinal,_func_void_void_ptr *xDestroy)

{
  uint uVar1;
  FuncDestructor *pDestructor;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (xDestroy == (_func_void_void_ptr *)0x0) {
    uVar1 = sqlite3CreateFunc(db,zFunc,nArg,enc,p,xSFunc,xStep,xFinal,(FuncDestructor *)0x0);
  }
  else {
    pDestructor = (FuncDestructor *)sqlite3DbMallocZero(db,0x18);
    if (pDestructor == (FuncDestructor *)0x0) {
      (*xDestroy)(p);
      uVar1 = 1;
    }
    else {
      pDestructor->xDestroy = xDestroy;
      pDestructor->pUserData = p;
      uVar1 = sqlite3CreateFunc(db,zFunc,nArg,enc,p,xSFunc,xStep,xFinal,pDestructor);
      if (pDestructor->nRef == 0) {
        (*xDestroy)(p);
        sqlite3DbFreeNN(db,pDestructor);
      }
    }
  }
  if (db->mallocFailed == '\0') {
    uVar1 = uVar1 & db->errMask;
  }
  else {
    apiOomError(db);
    uVar1 = 7;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_create_function_v2(
  sqlite3 *db,
  const char *zFunc,
  int nArg,
  int enc,
  void *p,
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value **),
  void (*xStep)(sqlite3_context*,int,sqlite3_value **),
  void (*xFinal)(sqlite3_context*),
  void (*xDestroy)(void *)
){
  int rc = SQLITE_ERROR;
  FuncDestructor *pArg = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( xDestroy ){
    pArg = (FuncDestructor *)sqlite3DbMallocZero(db, sizeof(FuncDestructor));
    if( !pArg ){
      xDestroy(p);
      goto out;
    }
    pArg->xDestroy = xDestroy;
    pArg->pUserData = p;
  }
  rc = sqlite3CreateFunc(db, zFunc, nArg, enc, p, xSFunc, xStep, xFinal, pArg);
  if( pArg && pArg->nRef==0 ){
    assert( rc!=SQLITE_OK );
    xDestroy(p);
    sqlite3DbFree(db, pArg);
  }

 out:
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}